

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

Type * __thiscall
soul::AST::EndpointDetails::getElementDataType
          (Type *__return_storage_ptr__,EndpointDetails *this,Expression *e)

{
  int iVar1;
  pointer pTVar2;
  vector<soul::Type,_std::allocator<soul::Type>_> local_38;
  
  getResolvedDataTypes(&local_38,this);
  pTVar2 = local_38.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  while( true ) {
    if (pTVar2 == local_38.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_38);
      throwInternalCompilerError("getElementDataType",0x41e);
    }
    iVar1 = (*(e->super_Statement).super_ASTObject._vptr_ASTObject[0x10])(e,pTVar2);
    if ((char)iVar1 != '\0') break;
    pTVar2 = pTVar2 + 1;
  }
  Type::Type(__return_storage_ptr__,pTVar2);
  std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_38);
  return __return_storage_ptr__;
}

Assistant:

Type getElementDataType (Expression& e) const
        {
            for (auto& type : getResolvedDataTypes())
                if (e.canSilentlyCastTo (type))
                    return type;

            SOUL_ASSERT_FALSE;
            return {};
        }